

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t fileSize(file_t file)

{
  bool_t bVar1;
  size_t sVar2;
  size_t size;
  size_t pos;
  file_t in_stack_ffffffffffffffd8;
  file_t in_stack_ffffffffffffffe0;
  file_t local_8;
  
  sVar2 = fileTell(in_stack_ffffffffffffffd8);
  if ((((sVar2 == 0xffffffffffffffff) ||
       (bVar1 = fileSeek(in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8,0), bVar1 == 0)
       ) || (local_8 = (file_t)fileTell(in_stack_ffffffffffffffd8),
            local_8 == (file_t)0xffffffffffffffff)) ||
     (bVar1 = fileSeek(local_8,(size_t)in_stack_ffffffffffffffd8,0), bVar1 == 0)) {
    local_8 = (file_t)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

size_t fileSize(file_t file)
{
	size_t pos;
	size_t size;
	ASSERT(fileIsValid(file));
	if ((pos = fileTell(file)) == SIZE_MAX ||
		!fileSeek(file, 0, SEEK_END) ||
		(size = fileTell(file)) == SIZE_MAX ||
		!fileSeek(file, pos, SEEK_SET))
		return SIZE_MAX;
	return size;
}